

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

double __thiscall
fasttext::Meter::recallAtPrecision(Meter *this,int32_t labelId,double precisionQuery)

{
  anon_class_16_2_bb67d68e aVar1;
  int32_t in_stack_00000064;
  double bestRecall;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *precisionRecall;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  __first;
  double local_40;
  pair<double,_double> local_38;
  pair<double,_double> *local_20;
  
  __first._M_current = &local_38;
  precisionRecallCurve((Meter *)bestRecall,in_stack_00000064);
  local_40 = 0.0;
  local_20 = __first._M_current;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::begin
            (in_stack_ffffffffffffff58);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::end
            (in_stack_ffffffffffffff58);
  aVar1.precisionQuery = (double)in_stack_ffffffffffffff58;
  aVar1.bestRecall = (double *)0x150e9a;
  aVar1 = std::
          for_each<__gnu_cxx::__normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,fasttext::Meter::recallAtPrecision(int,double)const::__0>
                    (__first,in_stack_ffffffffffffff60,aVar1);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             aVar1.precisionQuery);
  return local_40;
}

Assistant:

double Meter::recallAtPrecision(int32_t labelId, double precisionQuery) const {
  const auto& precisionRecall = precisionRecallCurve(labelId);
  double bestRecall = 0.0;
  std::for_each(
      precisionRecall.begin(),
      precisionRecall.end(),
      [&bestRecall, precisionQuery](const std::pair<double, double>& element) {
        if (element.first >= precisionQuery) {
          bestRecall = std::max(bestRecall, element.second);
        };
      });
  return bestRecall;
}